

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AStarFringe.cpp
# Opt level: O0

sptr __thiscall AStarFringe::extractFromFringe(AStarFringe *this)

{
  bool bVar1;
  const_reference pvVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_RSI;
  sptr sVar4;
  undefined1 local_30 [8];
  Node top;
  AStarFringe *this_local;
  
  bVar1 = std::
          priority_queue<AStarFringe::Node,_std::vector<AStarFringe::Node,_std::allocator<AStarFringe::Node>_>,_std::greater<AStarFringe::Node>_>
          ::empty((priority_queue<AStarFringe::Node,_std::vector<AStarFringe::Node,_std::allocator<AStarFringe::Node>_>,_std::greater<AStarFringe::Node>_>
                   *)(in_RSI + 0x38));
  if (bVar1) {
    std::shared_ptr<SearchNode>::shared_ptr((shared_ptr<SearchNode> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    pvVar2 = std::
             priority_queue<AStarFringe::Node,_std::vector<AStarFringe::Node,_std::allocator<AStarFringe::Node>_>,_std::greater<AStarFringe::Node>_>
             ::top((priority_queue<AStarFringe::Node,_std::vector<AStarFringe::Node,_std::allocator<AStarFringe::Node>_>,_std::greater<AStarFringe::Node>_>
                    *)(in_RSI + 0x38));
    Node::Node((Node *)local_30,pvVar2);
    std::
    priority_queue<AStarFringe::Node,_std::vector<AStarFringe::Node,_std::allocator<AStarFringe::Node>_>,_std::greater<AStarFringe::Node>_>
    ::pop((priority_queue<AStarFringe::Node,_std::vector<AStarFringe::Node,_std::allocator<AStarFringe::Node>_>,_std::greater<AStarFringe::Node>_>
           *)(in_RSI + 0x38));
    std::shared_ptr<SearchNode>::shared_ptr
              ((shared_ptr<SearchNode> *)this,(shared_ptr<SearchNode> *)local_30);
    Node::~Node((Node *)local_30);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (sptr)sVar4.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SearchNode::sptr AStarFringe::extractFromFringe() {
    if (fringe.empty()) {
        return nullptr;
    }

    Node top = fringe.top();
    fringe.pop();

    return top.node;
}